

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFParser.cc
# Opt level: O3

void __thiscall QPDFParser::addInt(QPDFParser *this,int count)

{
  _func_int **pp_Var1;
  long lVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  shared_ptr<QPDFObject> obj;
  shared_ptr<QPDFObject> local_30;
  
  pp_Var1 = (_func_int **)this->int_buffer[count % 2];
  p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
  p_Var5->_M_use_count = 1;
  p_Var5->_M_weak_count = 1;
  p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002eaaf0;
  local_30.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var5 + 1);
  p_Var5[1]._vptr__Sp_counted_base = pp_Var1;
  *(undefined1 *)&p_Var5[4]._vptr__Sp_counted_base = 4;
  p_Var5[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[5]._M_use_count = 0;
  p_Var5[5]._M_weak_count = 0;
  p_Var5[6]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[6]._M_use_count = -1;
  p_Var5[6]._M_weak_count = -1;
  uVar3 = *(undefined4 *)(this->last_offset_buffer + count % 2);
  uVar4 = *(undefined4 *)((long)(this->last_offset_buffer + count % 2) + 4);
  *(QPDF **)&p_Var5[5]._M_use_count = this->context;
  *(element_type **)&p_Var5[4]._M_use_count =
       (this->description).
       super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  local_30.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var5;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(p_Var5 + 5),
             &(this->description).
              super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  lVar2._0_4_ = p_Var5[6]._M_use_count;
  lVar2._4_4_ = p_Var5[6]._M_weak_count;
  if (lVar2 < 0) {
    p_Var5[6]._M_use_count = uVar3;
    p_Var5[6]._M_weak_count = uVar4;
  }
  add(this,&local_30);
  if (local_30.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  return;
}

Assistant:

void
QPDFParser::addInt(int count)
{
    auto obj = QPDFObject::create<QPDF_Integer>(int_buffer[count % 2]);
    obj->setDescription(context, description, last_offset_buffer[count % 2]);
    add(std::move(obj));
}